

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  uchar *in_RCX;
  uchar *data;
  secp256k1_fe *data_00;
  secp256k1_fe *out32;
  uchar *in_R8;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_ge p;
  secp256k1_sha256 sStack_1c0;
  secp256k1_pubkey *psStack_158;
  secp256k1_fe *psStack_150;
  undefined8 uStack_148;
  uchar *puStack_140;
  secp256k1_fe *psStack_138;
  secp256k1_fe local_120;
  secp256k1_fe local_f0;
  secp256k1_fe local_c0;
  secp256k1_ge local_90;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ellswift_decode_cold_4();
  }
  else if (pubkey != (secp256k1_pubkey *)0x0) {
    if (ell64 == (uchar *)0x0) {
      secp256k1_ellswift_decode_cold_2();
      return 0;
    }
    secp256k1_fe_impl_set_b32_mod(&local_c0,ell64);
    local_c0.magnitude = 1;
    local_c0.normalized = 0;
    secp256k1_fe_verify(&local_c0);
    secp256k1_fe_impl_set_b32_mod(&local_120,ell64 + 0x20);
    local_120.magnitude = 1;
    local_120.normalized = 0;
    secp256k1_fe_verify(&local_120);
    secp256k1_fe_normalize_var(&local_120);
    data_00 = &local_c0;
    secp256k1_ellswift_xswiftec_var(&local_f0,&local_c0,&local_120);
    out32 = &local_120;
    secp256k1_fe_verify(&local_120);
    if (local_120.normalized == 0) {
      secp256k1_ellswift_decode_cold_1();
      uStack_148 = 1;
      sStack_1c0.s[0] = 0x6a09e667;
      sStack_1c0.s[1] = 0xbb67ae85;
      sStack_1c0.s[2] = 0x3c6ef372;
      sStack_1c0.s[3] = 0xa54ff53a;
      sStack_1c0.s[4] = 0x510e527f;
      sStack_1c0.s[5] = 0x9b05688c;
      sStack_1c0.s[6] = 0x1f83d9ab;
      sStack_1c0.s[7] = 0x5be0cd19;
      sStack_1c0.bytes = 0;
      psStack_158 = pubkey;
      psStack_150 = &local_120;
      puStack_140 = ell64 + 0x20;
      psStack_138 = &local_c0;
      secp256k1_sha256_write(&sStack_1c0,in_R8,0x40);
      secp256k1_sha256_write(&sStack_1c0,data,0x40);
      secp256k1_sha256_write(&sStack_1c0,in_RCX,0x40);
      secp256k1_sha256_write(&sStack_1c0,(uchar *)data_00,0x20);
      secp256k1_sha256_finalize(&sStack_1c0,(uchar *)out32);
      return 1;
    }
    secp256k1_ge_set_xo_var(&local_90,&local_f0,(uint)local_120.n[0] & 1);
    secp256k1_ge_to_bytes(pubkey->data,&local_90);
    return 1;
  }
  secp256k1_ellswift_decode_cold_3();
  return 0;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}